

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpContext.cpp
# Opt level: O0

void __thiscall sing::HttpContext::HttpContext(HttpContext *this,int fd)

{
  int fd_local;
  HttpContext *this_local;
  
  this->fd = fd;
  this->working = false;
  Buffer::Buffer(&this->input);
  Buffer::Buffer(&this->output);
  this->state = REQUEST_LINE;
  HttpRequest::HttpRequest(&this->request);
  HttpResponse::HttpResponse(&this->response);
  std::weak_ptr<sing::Timer>::weak_ptr(&this->timer);
  if (-1 < fd) {
    return;
  }
  __assert_fail("fd>=0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/MisakiOfScut[P]SingHttpServer/src/Http/HttpContext.cpp"
                ,9,"sing::HttpContext::HttpContext(int)");
}

Assistant:

HttpContext::HttpContext(int fd)
    :state(REQUEST_LINE),fd(fd),working(false){
    assert(fd>=0);
}